

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O1

error __thiscall video::src_format<37,48>(video *this,context *ctx,token *token,opcode *op)

{
  uint uVar1;
  _Storage<unsigned_long,_true> _Var2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  string_view prefix;
  string_view prefix_00;
  optional<unsigned_long> oVar7;
  token local_58;
  
  prefix._M_str = ".";
  prefix._M_len = 1;
  oVar7 = find_in_table(token,src_format<37,_48>::signed_table,prefix);
  _Var2._M_value =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  uVar3 = oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._8_4_;
  uVar5 = 0x1000000000000;
  if (((undefined1  [16])
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    prefix_00._M_str = ".";
    prefix_00._M_len = 1;
    oVar7 = find_in_table(token,src_format<37,_48>::unsigned_table,prefix_00);
    bVar6 = ((undefined1  [16])
             oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0;
    if (bVar6) {
      _Var2._M_value =
           oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
    }
    uVar1 = uVar3 & 0xff;
    uVar3 = 1;
    if (!bVar6) {
      uVar3 = uVar1;
    }
    if ((uVar3 & 1) != 0) {
      uVar5 = 0;
    }
  }
  if ((uVar3 & 1) == 0) {
    uVar4 = 0x6000000000;
  }
  else {
    context::tokenize(&local_58,ctx);
    token->column = local_58.column;
    (token->data).string._M_str = local_58.data.string._M_str;
    token->type = local_58.type;
    token->line = local_58.line;
    token->filename = local_58.filename;
    (token->data).predicate = local_58.data.predicate;
    uVar4 = _Var2._M_value << 0x25;
  }
  if ((op->value & uVar4) == 0) {
    uVar4 = op->value | uVar4;
    op->value = uVar4;
    if ((uVar4 & uVar5) == 0) {
      op->value = uVar4 | uVar5;
      *(undefined8 *)this = 0;
      return (unique_ptr<char[],_std::default_delete<char[]>_>)
             (unique_ptr<char[],_std::default_delete<char[]>_>)this;
    }
  }
  __assert_fail("(value & bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                ,0x31,"void opcode::add_bits(uint64_t)");
}

Assistant:

DEFINE_OPERAND(src_format)
    {
        static const char* signed_table[] = {"S8", "", "S16", "S32", nullptr};
        static const char* unsigned_table[] = {"U8", "", "U16", "U32", nullptr};
        bool is_signed = true;
        std::optional<int64_t> result = find_in_table(token, signed_table, ".");
        if (!result) {
            is_signed = false;
            result = find_in_table(token, unsigned_table, ".");
            if (!result) {
                is_signed = true;
            }
        }
        if (result) {
            token = ctx.tokenize();
        }
        op.add_bits(result.value_or(3) << address); // .U32
        op.add_bits((is_signed ? 1ULL : 0ULL) << sign_address);
        return {};
    }